

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

AMQP_VALUE amqpvalue_create_binary(amqp_binary value)

{
  LOGGER_LOG p_Var1;
  undefined4 *puVar2;
  void *__dest;
  int iVar3;
  AMQP_VALUE pAVar4;
  uint32_t uVar5;
  char *pcVar6;
  
  uVar5 = value.length;
  if (uVar5 == 0 || value.bytes != (void *)0x0) {
    puVar2 = (undefined4 *)malloc(0x20);
    if (puVar2 == (undefined4 *)0x0) {
      pAVar4 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar4 = (AMQP_VALUE)(puVar2 + 2);
      *puVar2 = 1;
    }
    if (pAVar4 == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar6 = "Could not allocate memory for AMQP value";
        iVar3 = 0x3dd;
        goto LAB_00104f13;
      }
    }
    else {
      pAVar4->type = AMQP_TYPE_BINARY;
      if (uVar5 == 0) {
        __dest = (void *)0x0;
      }
      else {
        __dest = malloc(value._8_8_ & 0xffffffff);
      }
      (pAVar4->value).binary_value.bytes = __dest;
      (pAVar4->value).binary_value.length = uVar5;
      if (__dest != (void *)0x0 || uVar5 == 0) {
        if (uVar5 == 0) {
          return pAVar4;
        }
        memcpy(__dest,value.bytes,value._8_8_ & 0xffffffff);
        return pAVar4;
      }
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_binary",0x3f1,1,
                  "Could not allocate memory for binary payload of AMQP value");
      }
      free((void *)((long)&pAVar4[-1].value + 8));
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar6 = "NULL bytes with non-zero length";
      iVar3 = 0x3d4;
LAB_00104f13:
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_binary",iVar3,1,pcVar6);
      return (AMQP_VALUE)0x0;
    }
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_binary(amqp_binary value)
{
    AMQP_VALUE result;
    if ((value.bytes == NULL) &&
        (value.length > 0))
    {
        /* Codes_SRS_AMQPVALUE_01_129: [If value.data is NULL and value.length is positive then amqpvalue_create_binary shall return NULL.] */
        LogError("NULL bytes with non-zero length");
        result = NULL;
    }
    else
    {
        result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
        if (result == NULL)
        {
            /* Codes_SRS_AMQPVALUE_01_128: [If allocating the AMQP_VALUE fails then amqpvalue_create_binary shall return NULL.] */
            LogError("Could not allocate memory for AMQP value");
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_127: [amqpvalue_create_binary shall return a handle to an AMQP_VALUE that stores a sequence of bytes.] */
            result->type = AMQP_TYPE_BINARY;
            if (value.length > 0)
            {
                result->value.binary_value.bytes = malloc(value.length);
            }
            else
            {
                result->value.binary_value.bytes = NULL;
            }

            result->value.binary_value.length = value.length;

            if ((result->value.binary_value.bytes == NULL) && (value.length > 0))
            {
                /* Codes_SRS_AMQPVALUE_01_128: [If allocating the AMQP_VALUE fails then amqpvalue_create_binary shall return NULL.] */
                LogError("Could not allocate memory for binary payload of AMQP value");
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                if (value.length > 0)
                {
                    (void)memcpy((void*)result->value.binary_value.bytes, value.bytes, value.length);
                }
            }
        }
    }

    return result;
}